

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

ValidateXrFlagsResult ValidateXrPlaneDetectionCapabilityFlagsEXT(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = (value < 0x80) + VALIDATE_XR_FLAGS_INVALID;
  if (value == 0) {
    VVar1 = VALIDATE_XR_FLAGS_ZERO;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrPlaneDetectionCapabilityFlagsEXT(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_PLANE_DETECTION_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_PLANE_DETECTION_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_PLANE_DETECTION_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_PLANE_HOLES_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_PLANE_HOLES_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_PLANE_HOLES_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_CEILING_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_CEILING_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_CEILING_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_FLOOR_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_FLOOR_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_FLOOR_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_WALL_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_WALL_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_WALL_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_PLATFORM_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_PLATFORM_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_SEMANTIC_PLATFORM_BIT_EXT;
    }
    if ((int_value & XR_PLANE_DETECTION_CAPABILITY_ORIENTATION_BIT_EXT) != 0) {
        // Clear the value XR_PLANE_DETECTION_CAPABILITY_ORIENTATION_BIT_EXT since it is valid
        int_value &= ~XR_PLANE_DETECTION_CAPABILITY_ORIENTATION_BIT_EXT;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}